

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalGenerator::CheckTargetsForType(cmGlobalGenerator *this)

{
  cmLocalGenerator *pcVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  cmake *this_01;
  bool bVar3;
  byte bVar4;
  TargetType TVar5;
  int iVar6;
  string *psVar7;
  long lVar8;
  undefined8 uVar9;
  char *__end;
  pointer config;
  pointer puVar10;
  string systemName;
  string local_e8;
  string local_c8;
  undefined8 local_a8;
  pointer local_a0;
  pointer local_98;
  pointer local_90;
  cmGlobalGenerator *local_88;
  string *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Swift","");
  bVar3 = cmState::GetLanguageEnabled
                    ((this->CMakeInstance->State)._M_t.
                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                     super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    local_98 = (this->LocalGenerators).
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_a0 = (this->LocalGenerators).
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_98 != local_a0) {
      local_a8 = 0;
      local_88 = this;
      do {
        pcVar1 = (local_98->_M_t).
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                 super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
        puVar10 = *(pointer *)
                   &(pcVar1->GeneratorTargets).
                    super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                    ._M_impl;
        local_90 = *(pointer *)
                    ((long)&(pcVar1->GeneratorTargets).
                            super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                    + 8);
        if (puVar10 != local_90) {
          do {
            this_00 = *(cmMakefile **)
                       ((long)(puVar10->_M_t).
                              super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       + 8);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,"CMAKE_SYSTEM_NAME","");
            psVar7 = cmMakefile::GetSafeDefinition(this_00,&local_c8);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            pcVar2 = (psVar7->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e8,pcVar2,pcVar2 + psVar7->_M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            lVar8 = std::__cxx11::string::find((char *)&local_e8,0x8ab44e,0);
            if ((lVar8 != -1) &&
               (TVar5 = cmGeneratorTarget::GetType
                                  ((cmGeneratorTarget *)
                                   (puVar10->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                  ), TVar5 == EXECUTABLE)) {
              cmMakefile::GetGeneratorConfigs_abi_cxx11_
                        (&local_78,
                         *(cmMakefile **)
                          ((long)(puVar10->_M_t).
                                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          + 8),IncludeEmptyConfig);
              local_80 = local_78.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              uVar9 = local_a8;
              config = local_78.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                do {
                  bVar3 = cmGeneratorTarget::IsWin32Executable
                                    ((cmGeneratorTarget *)
                                     (puVar10->_M_t).
                                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                     ,config);
                  if (bVar3) {
                    cmGeneratorTarget::GetLinkerLanguage
                              ((string *)(local_60 + 0x10),
                               (cmGeneratorTarget *)
                               (puVar10->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               ,config);
                    iVar6 = std::__cxx11::string::compare((char *)(local_60 + 0x10));
                    bVar3 = iVar6 == 0;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_60._16_8_ != &local_40) {
                      operator_delete((void *)local_60._16_8_,local_40._M_allocated_capacity + 1);
                    }
                  }
                  else {
                    bVar3 = false;
                  }
                  if (bVar3) {
                    this_01 = local_88->CMakeInstance;
                    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_c8,
                               "WIN32_EXECUTABLE property is not supported on Swift executables","")
                    ;
                    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_60);
                    cmake::IssueMessage(this_01,FATAL_ERROR,&local_c8,
                                        (cmListFileBacktrace *)local_60);
                    if ((cmMakefile *)local_60._8_8_ != (cmMakefile *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                      operator_delete(local_c8._M_dataplus._M_p,
                                      local_c8.field_2._M_allocated_capacity + 1);
                    }
                    uVar9 = CONCAT71((int7)((ulong)&local_c8 >> 8),1);
                  }
                  config = config + 1;
                } while (config != local_80);
              }
              local_a8 = uVar9;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_78);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            puVar10 = puVar10 + 1;
          } while (puVar10 != local_90);
        }
        local_98 = local_98 + 1;
      } while (local_98 != local_a0);
      bVar4 = (byte)local_a8;
      goto LAB_002ab861;
    }
  }
  bVar4 = 0;
LAB_002ab861:
  return (bool)(bVar4 & 1);
}

Assistant:

bool cmGlobalGenerator::CheckTargetsForType() const
{
  if (!this->GetLanguageEnabled("Swift")) {
    return false;
  }
  bool failed = false;
  for (const auto& generator : this->LocalGenerators) {
    for (const auto& target : generator->GetGeneratorTargets()) {
      std::string systemName =
        target->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME");
      if (systemName.find("Windows") == std::string::npos) {
        continue;
      }

      if (target->GetType() == cmStateEnums::EXECUTABLE) {
        std::vector<std::string> const& configs =
          target->Makefile->GetGeneratorConfigs(
            cmMakefile::IncludeEmptyConfig);
        for (std::string const& config : configs) {
          if (target->IsWin32Executable(config) &&
              target->GetLinkerLanguage(config) == "Swift") {
            this->GetCMakeInstance()->IssueMessage(
              MessageType::FATAL_ERROR,
              "WIN32_EXECUTABLE property is not supported on Swift "
              "executables",
              target->GetBacktrace());
            failed = true;
          }
        }
      }
    }
  }
  return failed;
}